

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  long *plVar1;
  bool bVar2;
  Verbosity VVar3;
  long in_RDI;
  Verbosity old_verbosity;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000610;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000618;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  bool bVar4;
  SPxColId *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined1 uVar5;
  bool local_1b9;
  bool local_1a1;
  SPxRowId local_1a0;
  SPxColId local_198;
  undefined8 local_190;
  undefined1 local_188 [128];
  DataKey local_108;
  undefined4 local_100;
  Verbosity local_fc;
  SPxRowId local_f8;
  SPxColId local_f0;
  undefined1 local_e8 [128];
  DataKey local_68;
  DataKey local_58;
  long local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  undefined8 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  SPxId::SPxId((SPxId *)0x766ec9);
  local_50 = in_RDI + 0x18;
  local_48 = local_e8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),in_stack_fffffffffffffe18
            );
  local_68 = (DataKey)selectEnterX(in_stack_00000618,in_stack_00000610);
  local_58 = local_68;
  bVar2 = SPxId::isSPxColId((SPxId *)&local_58);
  local_1a1 = false;
  if (bVar2) {
    SPxColId::SPxColId(&local_f0,(SPxId *)&local_58);
    local_1a1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                          in_stack_fffffffffffffe28);
  }
  if (local_1a1 != false) {
    local_58 = (DataKey)((ulong)local_58 & 0xffffffff00000000);
  }
  bVar2 = SPxId::isSPxRowId((SPxId *)&local_58);
  local_1b9 = false;
  if (bVar2) {
    SPxRowId::SPxRowId(&local_f8,(SPxId *)&local_58);
    local_1b9 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                          (SPxRowId *)in_stack_fffffffffffffe28);
  }
  if (local_1b9 != false) {
    local_58 = (DataKey)((ulong)local_58 & 0xffffffff00000000);
  }
  bVar2 = SPxId::isValid((SPxId *)&local_58);
  if ((!bVar2) && ((*(byte *)(in_RDI + 0x1a0) & 1) == 0)) {
    *(undefined1 *)(in_RDI + 0x1a0) = 1;
    if ((*(long *)(*(long *)(in_RDI + 0x10) + 0x14b0) != 0) &&
       (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(*(long *)(in_RDI + 0x10) + 0x14b0)),
       4 < (int)VVar3)) {
      local_fc = SPxOut::getVerbosity(*(SPxOut **)(*(long *)(in_RDI + 0x10) + 0x14b0));
      plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x14b0);
      local_100 = 5;
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_100);
      soplex::operator<<((SPxOut *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                         (char *)in_stack_fffffffffffffe18);
      plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x14b0);
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_fc);
    }
    local_30 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(in_RDI + 0x18);
    local_190 = 0x4000000000000000;
    local_28 = local_188;
    local_38 = &local_190;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_30);
    local_20 = local_188;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    local_10 = local_188;
    local_18 = local_30;
    local_8 = local_38;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18,(double *)0x76719b);
    local_108 = (DataKey)selectEnterX(in_stack_00000618,in_stack_00000610);
    local_58 = local_108;
    bVar2 = SPxId::isSPxColId((SPxId *)&local_58);
    uVar5 = false;
    if (bVar2) {
      in_stack_fffffffffffffe28 = *(SPxColId **)(in_RDI + 0x10);
      SPxColId::SPxColId(&local_198,(SPxId *)&local_58);
      uVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT17(uVar5,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28);
    }
    if ((bool)uVar5 != false) {
      local_58 = (DataKey)((ulong)local_58 & 0xffffffff00000000);
    }
    bVar2 = SPxId::isSPxRowId((SPxId *)&local_58);
    bVar4 = false;
    if (bVar2) {
      SPxRowId::SPxRowId(&local_1a0,(SPxId *)&local_58);
      bVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT17(uVar5,in_stack_fffffffffffffe30),
                        (SPxRowId *)in_stack_fffffffffffffe28);
    }
    if (bVar4 != false) {
      local_58 = (DataKey)((ulong)local_58 & 0xffffffff00000000);
    }
  }
  return (SPxId)local_58;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);

   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
      enterId.info = 0;

   if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
      enterId.info = 0;

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);

      if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
         enterId.info = 0;

      if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
         enterId.info = 0;
   }

   return enterId;
}